

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O0

void __thiscall
aeron::ClientConductor::SubscriptionStateDefn::SubscriptionStateDefn
          (SubscriptionStateDefn *this,string *channel,int64_t registrationId,int32_t streamId,
          longlong now,on_available_image_t *onAvailableImageHandler,
          on_unavailable_image_t *onUnavailableImageHandler)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  string *in_RSI;
  string *in_RDI;
  function<void_(aeron::Image_&)> *__x;
  function<void_(aeron::Image_&)> *this_00;
  undefined8 in_R8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = in_RDX;
  *(undefined4 *)(in_RDI + 0x28) = in_ECX;
  *(undefined8 *)(in_RDI + 0x30) = in_R8;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  __x = (function<void_(aeron::Image_&)> *)(in_RDI + 0x40);
  std::__cxx11::string::string((string *)__x);
  this_00 = (function<void_(aeron::Image_&)> *)(in_RDI + 0x60);
  std::shared_ptr<aeron::Subscription>::shared_ptr((shared_ptr<aeron::Subscription> *)0x2081cb);
  std::weak_ptr<aeron::Subscription>::weak_ptr((weak_ptr<aeron::Subscription> *)0x2081de);
  std::function<void_(aeron::Image_&)>::function(this_00,__x);
  std::function<void_(aeron::Image_&)>::function(this_00,__x);
  return;
}

Assistant:

SubscriptionStateDefn(
            const std::string& channel,
            std::int64_t registrationId,
            std::int32_t streamId,
            long long now,
            const on_available_image_t &onAvailableImageHandler,
            const on_unavailable_image_t &onUnavailableImageHandler) :
            m_channel(channel),
            m_registrationId(registrationId),
            m_streamId(streamId),
            m_timeOfRegistration(now),
            m_onAvailableImageHandler(onAvailableImageHandler),
            m_onUnavailableImageHandler(onUnavailableImageHandler)
        {
        }